

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

uintwide_t<256U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::operator/=
          (uintwide_t<256U,_unsigned_int,_void,_true> *this,
          uintwide_t<256U,_unsigned_int,_void,_true> *other)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  representation_type *prVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  local_unsigned_wide_type a;
  local_unsigned_wide_type b;
  uintwide_t<256U,_unsigned_int,_void,_false> local_58;
  uintwide_t<256U,_unsigned_int,_void,_false> local_38;
  
  if (this == other) {
    (this->values).super_array<unsigned_int,_8UL>.elems[0] = 1;
    prVar5 = &this->values;
    (prVar5->super_array<unsigned_int,_8UL>).elems[1] = 0;
    (prVar5->super_array<unsigned_int,_8UL>).elems[2] = 0;
    (prVar5->super_array<unsigned_int,_8UL>).elems[3] = 0;
    (prVar5->super_array<unsigned_int,_8UL>).elems[4] = 0;
    prVar5 = &this->values;
    (prVar5->super_array<unsigned_int,_8UL>).elems[4] = 0;
    (prVar5->super_array<unsigned_int,_8UL>).elems[5] = 0;
    (prVar5->super_array<unsigned_int,_8UL>).elems[6] = 0;
    (prVar5->super_array<unsigned_int,_8UL>).elems[7] = 0;
  }
  else {
    if ((other->values).super_array<unsigned_int,_8UL>.elems[0] == 0) {
      lVar7 = 4;
      do {
        lVar6 = lVar7;
        if (lVar6 == 0x20) goto LAB_0013ae01;
        lVar7 = lVar6 + 4;
      } while (*(int *)((long)(other->values).super_array<unsigned_int,_8UL>.elems + lVar6) == 0);
      if (lVar6 == 0x20) {
LAB_0013ae01:
        (this->values).super_array<unsigned_int,_8UL>.elems[3] = 0xffffffff;
        (this->values).super_array<unsigned_int,_8UL>.elems[4] = 0xffffffff;
        (this->values).super_array<unsigned_int,_8UL>.elems[5] = 0xffffffff;
        (this->values).super_array<unsigned_int,_8UL>.elems[6] = 0xffffffff;
        (this->values).super_array<unsigned_int,_8UL>.elems[0] = 0xffffffff;
        (this->values).super_array<unsigned_int,_8UL>.elems[1] = 0xffffffff;
        (this->values).super_array<unsigned_int,_8UL>.elems[2] = 0xffffffff;
        (this->values).super_array<unsigned_int,_8UL>.elems[3] = 0xffffffff;
        (this->values).super_array<unsigned_int,_8UL>.elems[7] = 0x7fffffff;
        return this;
      }
    }
    uVar3 = (this->values).super_array<unsigned_int,_8UL>.elems[7];
    uVar4 = (other->values).super_array<unsigned_int,_8UL>.elems[7];
    if ((int)(uVar4 | uVar3) < 0) {
      local_58.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
           *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 4);
      local_58.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
           *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 6);
      local_58.values.super_array<unsigned_int,_8UL>.elems._0_8_ =
           *(undefined8 *)(this->values).super_array<unsigned_int,_8UL>.elems;
      local_58.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
           *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 2);
      local_38.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
           *(undefined8 *)((other->values).super_array<unsigned_int,_8UL>.elems + 4);
      local_38.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
           *(undefined8 *)((other->values).super_array<unsigned_int,_8UL>.elems + 6);
      local_38.values.super_array<unsigned_int,_8UL>.elems._0_8_ =
           *(undefined8 *)(other->values).super_array<unsigned_int,_8UL>.elems;
      local_38.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
           *(undefined8 *)((other->values).super_array<unsigned_int,_8UL>.elems + 2);
      if ((int)uVar3 < 0) {
        lVar7 = 0;
        do {
          puVar1 = (uint *)((long)local_58.values.super_array<unsigned_int,_8UL>.elems + lVar7);
          *puVar1 = ~*puVar1;
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x20);
        lVar7 = 0;
        do {
          piVar2 = (int *)((long)local_58.values.super_array<unsigned_int,_8UL>.elems + lVar7);
          *piVar2 = *piVar2 + 1;
          if (*piVar2 != 0) break;
          bVar8 = lVar7 != 0x1c;
          lVar7 = lVar7 + 4;
        } while (bVar8);
      }
      if ((int)uVar4 < 0) {
        lVar7 = 0;
        do {
          puVar1 = (uint *)((long)local_38.values.super_array<unsigned_int,_8UL>.elems + lVar7);
          *puVar1 = ~*puVar1;
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x20);
        lVar7 = 0;
        do {
          piVar2 = (int *)((long)local_38.values.super_array<unsigned_int,_8UL>.elems + lVar7);
          *piVar2 = *piVar2 + 1;
          if (*piVar2 != 0) break;
          bVar8 = lVar7 != 0x1c;
          lVar7 = lVar7 + 4;
        } while (bVar8);
      }
      uintwide_t<256U,_unsigned_int,_void,_false>::eval_divide_knuth
                (&local_58,&local_38,(uintwide_t<256U,_unsigned_int,_void,_false> *)0x0);
      if ((int)uVar3 < 0 != (int)uVar4 < 0) {
        lVar7 = 0;
        do {
          puVar1 = (uint *)((long)local_58.values.super_array<unsigned_int,_8UL>.elems + lVar7);
          *puVar1 = ~*puVar1;
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x20);
        lVar7 = 0;
        do {
          piVar2 = (int *)((long)local_58.values.super_array<unsigned_int,_8UL>.elems + lVar7);
          *piVar2 = *piVar2 + 1;
          if (*piVar2 != 0) break;
          bVar8 = lVar7 != 0x1c;
          lVar7 = lVar7 + 4;
        } while (bVar8);
      }
      *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 4) =
           local_58.values.super_array<unsigned_int,_8UL>.elems._16_8_;
      *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 6) =
           local_58.values.super_array<unsigned_int,_8UL>.elems._24_8_;
      *(undefined8 *)(this->values).super_array<unsigned_int,_8UL>.elems =
           local_58.values.super_array<unsigned_int,_8UL>.elems._0_8_;
      *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 2) =
           local_58.values.super_array<unsigned_int,_8UL>.elems._8_8_;
    }
    else {
      eval_divide_knuth(this,other,(uintwide_t<256U,_unsigned_int,_void,_true> *)0x0);
    }
  }
  return this;
}

Assistant:

constexpr auto operator/=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        values.front() = static_cast<limb_type>(UINT8_C(1));

        detail::fill_unsafe(detail::advance_and_point(values.begin(), 1U), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else if(other.is_zero())
      {
        static_cast<void>(operator=(limits_helper_max<IsSigned>()));
      }
      else
      {
        // Unary division function.

        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          a.eval_divide_knuth(b);

          if(numer_was_neg != denom_was_neg) { a.negate(); }

          values = a.values;
        }
        else
        {
          eval_divide_knuth(other);
        }
      }

      return *this;
    }